

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

void __thiscall
embree::MetallicPaintMaterial::MetallicPaintMaterial
          (MetallicPaintMaterial *this,Vec3fa *shadeColor,Vec3fa *glitterColor,float glitterSpread,
          float eta)

{
  undefined8 uVar1;
  allocator local_49;
  float local_48;
  float local_44;
  string local_40;
  
  local_48 = glitterSpread;
  local_44 = eta;
  std::__cxx11::string::string((string *)&local_40,"",&local_49);
  SceneGraph::MaterialNode::MaterialNode(&this->super_MaterialNode,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_0024b700;
  (this->base).type = 5;
  uVar1 = *(undefined8 *)((long)&shadeColor->field_0 + 8);
  *(undefined8 *)&(this->shadeColor).field_0 = *(undefined8 *)&shadeColor->field_0;
  *(undefined8 *)((long)&(this->shadeColor).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&glitterColor->field_0 + 8);
  *(undefined8 *)&(this->glitterColor).field_0 = *(undefined8 *)&glitterColor->field_0;
  *(undefined8 *)((long)&(this->glitterColor).field_0 + 8) = uVar1;
  this->glitterSpread = local_48;
  this->eta = local_44;
  return;
}

Assistant:

MetallicPaintMaterial (const Vec3fa& shadeColor, const Vec3fa& glitterColor, float glitterSpread, float eta)
      : base(MATERIAL_METALLIC_PAINT), shadeColor(shadeColor), glitterColor(glitterColor), glitterSpread(glitterSpread), eta(eta) {}